

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.h
# Opt level: O3

ParseNodeFor *
InvertLoop(ParseNode *outerLoop,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ParseNode *pPVar1;
  IdentPtr pIVar2;
  Symbol *outerVar;
  bool bVar3;
  ParseNodeFor *pPVar4;
  ParseNodeBlock *pPVar5;
  ParseNodeVar *pPVar6;
  ParseNodeUni *pPVar7;
  ParseNodeName *pPVar8;
  undefined1 local_80 [8];
  SymCheck symCheck;
  
  if ((byteCodeGenerator->scriptContext->optimizationOverrides).sideEffects != SideEffects_None) {
    return (ParseNodeFor *)0x0;
  }
  symCheck.permittedSym._0_4_ = 0;
  symCheck.permittedSym._4_1_ = 1;
  if (outerLoop->nop == knopFor) {
    pPVar4 = ParseNode::AsParseNodeFor(outerLoop);
    pPVar1 = pPVar4->pnodeBody;
    if ((pPVar1 != (ParseNode *)0x0) && (pPVar1->nop == knopBlock)) {
      pPVar5 = ParseNode::AsParseNodeBlock(pPVar1);
      pPVar1 = pPVar5->pnodeStmt;
      if ((pPVar1 != (ParseNode *)0x0) &&
         (((pPVar1->nop == knopFor &&
           (pPVar4 = ParseNode::AsParseNodeFor(outerLoop), pPVar4->pnodeInit != (ParseNodePtr)0x0))
          && (pPVar4 = ParseNode::AsParseNodeFor(outerLoop), pPVar4->pnodeInit->nop == knopVarDecl))
         )) {
        pPVar4 = ParseNode::AsParseNodeFor(outerLoop);
        pPVar6 = ParseNode::AsParseNodeVar(pPVar4->pnodeInit);
        if (pPVar6->pnodeInit != (ParseNodePtr)0x0) {
          pPVar4 = ParseNode::AsParseNodeFor(outerLoop);
          pPVar6 = ParseNode::AsParseNodeVar(pPVar4->pnodeInit);
          if (((pPVar6->pnodeInit->nop == knopInt) &&
              (pPVar4 = ParseNode::AsParseNodeFor(outerLoop), pPVar4->pnodeIncr != (ParseNodePtr)0x0
              )) && ((pPVar4 = ParseNode::AsParseNodeFor(outerLoop),
                     pPVar4->pnodeIncr->nop == knopIncPre ||
                     (pPVar4 = ParseNode::AsParseNodeFor(outerLoop),
                     pPVar4->pnodeIncr->nop == knopIncPost)))) {
            pPVar4 = ParseNode::AsParseNodeFor(outerLoop);
            pPVar7 = ParseNode::AsParseNodeUni(pPVar4->pnodeIncr);
            if (pPVar7->pnode1->nop == knopName) {
              pPVar4 = ParseNode::AsParseNodeFor(outerLoop);
              pPVar6 = ParseNode::AsParseNodeVar(pPVar4->pnodeInit);
              pIVar2 = pPVar6->pid;
              pPVar4 = ParseNode::AsParseNodeFor(outerLoop);
              pPVar7 = ParseNode::AsParseNodeUni(pPVar4->pnodeIncr);
              pPVar8 = ParseNode::AsParseNodeName(pPVar7->pnode1);
              if (((pIVar2 == pPVar8->pid) &&
                  (pPVar4 = ParseNode::AsParseNodeFor(pPVar1),
                  pPVar4->pnodeIncr != (ParseNodePtr)0x0)) &&
                 (((pPVar4 = ParseNode::AsParseNodeFor(pPVar1), pPVar4->pnodeIncr->nop == knopIncPre
                   || (pPVar4 = ParseNode::AsParseNodeFor(pPVar1),
                      pPVar4->pnodeIncr->nop == knopIncPost)) &&
                  ((pPVar4 = ParseNode::AsParseNodeFor(pPVar1),
                   pPVar4->pnodeInit != (ParseNodePtr)0x0 &&
                   (pPVar4 = ParseNode::AsParseNodeFor(pPVar1),
                   pPVar4->pnodeInit->nop == knopVarDecl)))))) {
                pPVar4 = ParseNode::AsParseNodeFor(pPVar1);
                pPVar6 = ParseNode::AsParseNodeVar(pPVar4->pnodeInit);
                if (pPVar6->pnodeInit != (ParseNodePtr)0x0) {
                  pPVar4 = ParseNode::AsParseNodeFor(pPVar1);
                  pPVar6 = ParseNode::AsParseNodeVar(pPVar4->pnodeInit);
                  if (pPVar6->pnodeInit->nop == knopInt) {
                    pPVar4 = ParseNode::AsParseNodeFor(pPVar1);
                    pPVar7 = ParseNode::AsParseNodeUni(pPVar4->pnodeIncr);
                    if (pPVar7->pnode1->nop == knopName) {
                      pPVar4 = ParseNode::AsParseNodeFor(pPVar1);
                      pPVar6 = ParseNode::AsParseNodeVar(pPVar4->pnodeInit);
                      pIVar2 = pPVar6->pid;
                      pPVar4 = ParseNode::AsParseNodeFor(pPVar1);
                      pPVar7 = ParseNode::AsParseNodeUni(pPVar4->pnodeIncr);
                      pPVar8 = ParseNode::AsParseNodeName(pPVar7->pnode1);
                      if (pIVar2 == pPVar8->pid) {
                        pPVar4 = ParseNode::AsParseNodeFor(outerLoop);
                        pPVar6 = ParseNode::AsParseNodeVar(pPVar4->pnodeInit);
                        outerVar = pPVar6->sym;
                        pPVar4 = ParseNode::AsParseNodeFor(pPVar1);
                        pPVar6 = ParseNode::AsParseNodeVar(pPVar4->pnodeInit);
                        if (outerVar == (Symbol *)0x0) {
                          return (ParseNodeFor *)0x0;
                        }
                        if (pPVar6->sym == (Symbol *)0x0) {
                          return (ParseNodeFor *)0x0;
                        }
                        pPVar4 = ParseNode::AsParseNodeFor(pPVar1);
                        bVar3 = InvertableBlock(pPVar4->pnodeBody,outerVar,pPVar1,outerLoop,
                                                byteCodeGenerator,(SymCheck *)local_80);
                        if (bVar3) {
                          pPVar4 = ConstructInvertedLoop
                                             (pPVar1,outerLoop,byteCodeGenerator,funcInfo);
                          return pPVar4;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (ParseNodeFor *)0x0;
}

Assistant:

Js::ScriptContext* GetScriptContext() { return scriptContext; }